

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassSerializeBinaryField
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  FieldDescriptor FVar3;
  FieldDescriptor *this_00;
  FieldDescriptor *this_01;
  Descriptor *descriptor;
  uint *args_1;
  undefined1 *field_00;
  FieldDescriptor *field_01;
  GeneratorOptions *options_00;
  GeneratorOptions *options_01;
  char *pcVar4;
  BytesMode in_R8D;
  undefined1 in_R9B;
  char *text;
  undefined1 in_stack_ffffffffffffff38;
  undefined1 local_c0 [32];
  string typed_annotation;
  undefined1 local_70 [32];
  string local_50;
  
  bVar2 = anon_unknown_0::HasFieldPresence((GeneratorOptions *)field,(FieldDescriptor *)options);
  if (bVar2) {
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      typed_annotation._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_c0._0_8_ = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&typed_annotation,
                 (FieldDescriptor **)local_c0);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4) == 10)
    goto LAB_00259bcb;
    (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
              (&typed_annotation,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)0x0,false,false,false,BYTES_DEFAULT,
               (bool)in_stack_ffffffffffffff38);
    (anonymous_namespace)::JSFieldIndex_abi_cxx11_
              ((string *)local_c0,(_anonymous_namespace_ *)field,field_01);
    pcVar4 = "  f = /** @type {$type$} */ (jspb.Message.getField(message, $index$));\n";
    args_1 = (uint *)local_c0;
    io::Printer::Print<char[6],std::__cxx11::string,char[5],std::__cxx11::string>
              (printer,"  f = /** @type {$type$} */ (jspb.Message.getField(message, $index$));\n",
               (char (*) [6])0x3f1802,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1,
               (char (*) [5])0x43947f,&typed_annotation);
    if ((FieldDescriptor *)local_c0._0_8_ != (FieldDescriptor *)(local_c0 + 0x10)) {
      operator_delete((void *)local_c0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)typed_annotation._M_dataplus._M_p != &typed_annotation.field_2) goto LAB_00259cdf;
  }
  else {
LAB_00259bcb:
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (&typed_annotation,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x2,
               (FieldDescriptor *)0x0,in_R8D,(bool)in_R9B);
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_c0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_70._0_8_ = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_c0,
                 (FieldDescriptor **)local_70);
    }
    if (field[2] == (FieldDescriptor)0xb) {
      bVar2 = FieldDescriptor::is_map_message_type(field);
      local_50._M_dataplus._M_p = "";
      if (bVar2) {
        local_50._M_dataplus._M_p = "true";
      }
    }
    else {
      local_50._M_dataplus._M_p = "";
    }
    pcVar4 = "  f = message.get$name$($nolazy$);\n";
    args_1 = (uint *)&typed_annotation;
    io::Printer::Print<char[5],std::__cxx11::string,char[7],char_const*>
              (printer,"  f = message.get$name$($nolazy$);\n",(char (*) [5])0x3ea8a1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1,
               (char (*) [7])"nolazy",(char **)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)typed_annotation._M_dataplus._M_p != &typed_annotation.field_2) {
LAB_00259cdf:
      operator_delete(typed_annotation._M_dataplus._M_p);
    }
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    pcVar4 = (char *)&typed_annotation;
    typed_annotation._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_c0._0_8_ = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)pcVar4,
               (FieldDescriptor **)local_c0);
  }
  if ((field[2] == (FieldDescriptor)0xb) &&
     (bVar2 = FieldDescriptor::is_map_message_type(field), bVar2)) {
    text = "  if (f && f.getLength() > 0) {\n";
  }
  else {
    text = "  if (f.length > 0) {\n";
    if ((~(byte)field[1] & 0x60) != 0) {
      bVar2 = anon_unknown_0::HasFieldPresence((GeneratorOptions *)field,(FieldDescriptor *)pcVar4);
      if (bVar2) {
        text = "  if (f != null) {\n";
      }
      else {
        if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
          typed_annotation._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
          local_c0._0_8_ = field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(field + 0x18),
                     (_func_void_FieldDescriptor_ptr **)&typed_annotation,
                     (FieldDescriptor **)local_c0);
        }
        args_1 = &switchD_00259d9f::switchdataD_003df320;
        switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4)) {
        case 1:
        case 2:
        case 3:
        case 4:
          bVar2 = anon_unknown_0::IsIntegralFieldWithStringJSType(field);
          text = "  if (f !== 0) {\n";
          args_1 = (uint *)"  if (parseInt(f, 10) !== 0) {\n";
          if (bVar2) {
            text = "  if (parseInt(f, 10) !== 0) {\n";
          }
          break;
        case 5:
        case 6:
        case 8:
          text = "  if (f !== 0.0) {\n";
          break;
        case 7:
          text = "  if (f) {\n";
          break;
        case 9:
          break;
        default:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                        ,0xcd5,
                        "void google::protobuf::compiler::js::Generator::GenerateClassSerializeBinaryField(const GeneratorOptions &, io::Printer *, const FieldDescriptor *) const"
                       );
        }
      }
    }
  }
  io::Printer::Print<>(printer,text);
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    typed_annotation._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_c0._0_8_ = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&typed_annotation,
               (FieldDescriptor **)local_c0);
  }
  if ((field[2] == (FieldDescriptor)0xb) &&
     (bVar2 = FieldDescriptor::is_map_message_type(field), bVar2)) {
    this_00 = anon_unknown_0::MapFieldKey(field);
    this_01 = anon_unknown_0::MapFieldValue(field);
    paVar1 = &typed_annotation.field_2;
    typed_annotation._M_dataplus._M_p = (pointer)paVar1;
    pcVar4 = FastInt32ToBufferLeft(*(int32 *)(field + 4),paVar1->_M_local_buf);
    typed_annotation._M_string_length = (long)pcVar4 - (long)paVar1;
    local_c0._0_8_ = (FieldDescriptor *)(local_c0 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c0,typed_annotation._M_dataplus._M_p,
               typed_annotation._M_dataplus._M_p + typed_annotation._M_string_length);
    (anonymous_namespace)::JSBinaryWriterMethodName_abi_cxx11_
              ((string *)local_70,(_anonymous_namespace_ *)this_00,options_00,
               (FieldDescriptor *)args_1);
    (anonymous_namespace)::JSBinaryWriterMethodName_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)this_01,options_01,(FieldDescriptor *)args_1);
    io::Printer::
    Print<char[6],std::__cxx11::string,char[12],std::__cxx11::string,char[14],std::__cxx11::string>
              (printer,"    f.serializeBinary($index$, writer, $keyWriterFn$, $valueWriterFn$",
               (char (*) [6])0x3f1802,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
               (char (*) [12])"keyWriterFn",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
               (char (*) [14])"valueWriterFn",&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((FieldDescriptor *)local_70._0_8_ != (FieldDescriptor *)(local_70 + 0x10)) {
      operator_delete((void *)local_70._0_8_);
    }
    if ((FieldDescriptor *)local_c0._0_8_ != (FieldDescriptor *)(local_c0 + 0x10)) {
      operator_delete((void *)local_c0._0_8_);
    }
    if (*(once_flag **)(this_01 + 0x18) != (once_flag *)0x0) {
      typed_annotation._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_c0._0_8_ = this_01;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this_01 + 0x18),
                 (_func_void_FieldDescriptor_ptr **)&typed_annotation,(FieldDescriptor **)local_c0);
    }
    pcVar4 = ");\n";
    if (this_01[2] == (FieldDescriptor)0xb) {
      descriptor = FieldDescriptor::message_type(this_01);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (&typed_annotation,
                 (_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
                 (GeneratorOptions *)(options->namespace_prefix)._M_string_length,descriptor);
      io::Printer::Print<char[12],std::__cxx11::string>
                (printer,", $messageType$.serializeBinaryToWriter",(char (*) [12])"messageType",
                 &typed_annotation);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)typed_annotation._M_dataplus._M_p != paVar1) {
        operator_delete(typed_annotation._M_dataplus._M_p);
      }
    }
    goto LAB_0025a0d5;
  }
  (anonymous_namespace)::JSBinaryReadWriteMethodName_abi_cxx11_
            ((string *)local_c0,(_anonymous_namespace_ *)field,(FieldDescriptor *)0x1,
             SUB81(args_1,0));
  paVar1 = &typed_annotation.field_2;
  typed_annotation._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = FastInt32ToBufferLeft(*(int32 *)(field + 4),paVar1->_M_local_buf);
  typed_annotation._M_string_length = (long)pcVar4 - (long)paVar1;
  local_70._0_8_ = (FieldDescriptor *)(local_70 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,typed_annotation._M_dataplus._M_p,
             typed_annotation._M_dataplus._M_p + typed_annotation._M_string_length);
  io::Printer::Print<char[7],std::__cxx11::string,char[6],std::__cxx11::string>
            (printer,"    writer.write$method$(\n      $index$,\n      f",(char (*) [7])"method",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
             (char (*) [6])0x3f1802,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  if ((FieldDescriptor *)local_70._0_8_ != (FieldDescriptor *)(local_70 + 0x10)) {
    operator_delete((void *)local_70._0_8_);
  }
  if ((FieldDescriptor *)local_c0._0_8_ != (FieldDescriptor *)(local_c0 + 0x10)) {
    operator_delete((void *)local_c0._0_8_);
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    typed_annotation._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_c0._0_8_ = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&typed_annotation,
               (FieldDescriptor **)local_c0);
  }
  FVar3 = field[2];
  field_00 = FieldDescriptor::kTypeToCppTypeMap;
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)FVar3 * 4) == 10) {
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      typed_annotation._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_c0._0_8_ = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&typed_annotation,
                 (FieldDescriptor **)local_c0);
      FVar3 = field[2];
    }
    if ((FVar3 == (FieldDescriptor)0xb) &&
       (bVar2 = FieldDescriptor::is_map_message_type(field), bVar2)) goto LAB_0025a082;
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (&typed_annotation,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)field_00);
    io::Printer::Print<char[7],std::__cxx11::string>
              (printer,",\n      $submsg$.serializeBinaryToWriter\n",(char (*) [7])"submsg",
               &typed_annotation);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)typed_annotation._M_dataplus._M_p != paVar1) {
      operator_delete(typed_annotation._M_dataplus._M_p);
    }
  }
  else {
LAB_0025a082:
    io::Printer::Print<>(printer,"\n");
  }
  pcVar4 = "    );\n";
LAB_0025a0d5:
  io::Printer::Print<>(printer,pcVar4);
  io::Printer::Print<>(printer,"  }\n");
  return;
}

Assistant:

void Generator::GenerateClassSerializeBinaryField(
    const GeneratorOptions& options, io::Printer* printer,
    const FieldDescriptor* field) const {
  if (HasFieldPresence(options, field) &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    std::string typed_annotation =
        JSFieldTypeAnnotation(options, field,
                              /* is_setter_argument = */ false,
                              /* force_present = */ false,
                              /* singular_if_not_packed = */ false,
                              /* bytes_mode = */ BYTES_DEFAULT);
    printer->Print(
        "  f = /** @type {$type$} */ "
        "(jspb.Message.getField(message, $index$));\n",
        "index", JSFieldIndex(field), "type", typed_annotation);
  } else {
    printer->Print(
        "  f = message.get$name$($nolazy$);\n", "name",
        JSGetterName(options, field, BYTES_U8),
        // No lazy creation for maps containers -- fastpath the empty case.
        "nolazy", field->is_map() ? "true" : "");
  }

  // Print an `if (condition)` statement that evaluates to true if the field
  // goes on the wire.
  if (field->is_map()) {
    printer->Print("  if (f && f.getLength() > 0) {\n");
  } else if (field->is_repeated()) {
    printer->Print("  if (f.length > 0) {\n");
  } else {
    if (HasFieldPresence(options, field)) {
      printer->Print("  if (f != null) {\n");
    } else {
      // No field presence: serialize onto the wire only if value is
      // non-default.  Defaults are documented here:
      // https://goto.google.com/lhdfm
      switch (field->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
        case FieldDescriptor::CPPTYPE_INT64:
        case FieldDescriptor::CPPTYPE_UINT32:
        case FieldDescriptor::CPPTYPE_UINT64: {
          if (IsIntegralFieldWithStringJSType(field)) {
            // We can use `parseInt` here even though it will not be precise for
            // 64-bit quantities because we are only testing for zero/nonzero,
            // and JS numbers (64-bit floating point values, i.e., doubles) are
            // integer-precise in the range that includes zero.
            printer->Print("  if (parseInt(f, 10) !== 0) {\n");
          } else {
            printer->Print("  if (f !== 0) {\n");
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_ENUM:
        case FieldDescriptor::CPPTYPE_FLOAT:
        case FieldDescriptor::CPPTYPE_DOUBLE:
          printer->Print("  if (f !== 0.0) {\n");
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          printer->Print("  if (f) {\n");
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          printer->Print("  if (f.length > 0) {\n");
          break;
        default:
          assert(false);
          break;
      }
    }
  }

  // Write the field on the wire.
  if (field->is_map()) {
    const FieldDescriptor* key_field = MapFieldKey(field);
    const FieldDescriptor* value_field = MapFieldValue(field);
    printer->Print(
        "    f.serializeBinary($index$, writer, "
        "$keyWriterFn$, $valueWriterFn$",
        "index", StrCat(field->number()), "keyWriterFn",
        JSBinaryWriterMethodName(options, key_field), "valueWriterFn",
        JSBinaryWriterMethodName(options, value_field));

    if (value_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      printer->Print(", $messageType$.serializeBinaryToWriter", "messageType",
                     GetMessagePath(options, value_field->message_type()));
    }

    printer->Print(");\n");
  } else {
    printer->Print(
        "    writer.write$method$(\n"
        "      $index$,\n"
        "      f",
        "method", JSBinaryReadWriteMethodName(field, /* is_writer = */ true),
        "index", StrCat(field->number()));

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !field->is_map()) {
      printer->Print(
          ",\n"
          "      $submsg$.serializeBinaryToWriter\n",
          "submsg", SubmessageTypeRef(options, field));
    } else {
      printer->Print("\n");
    }

    printer->Print("    );\n");
  }

  // Close the `if`.
  printer->Print("  }\n");
}